

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnTable
          (BinaryReaderInterp *this,Index index,Type elem_type,Limits *elem_limits)

{
  undefined4 uVar1;
  uint64_t uVar2;
  Result RVar3;
  Enum EVar4;
  value_type local_68;
  TableDesc local_40;
  
  RVar3 = SharedValidator::OnTable
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     elem_type,elem_limits);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    local_68.limits.initial = elem_limits->initial;
    uVar2 = elem_limits->max;
    local_68.limits.max._0_2_ = (undefined2)uVar2;
    local_68.limits.max._2_2_ = (undefined2)(uVar2 >> 0x10);
    local_68.limits.max._4_4_ = (undefined4)(uVar2 >> 0x20);
    local_68.limits.has_max = elem_limits->has_max;
    local_68.super_ExternType.kind = Table;
    local_68.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e48e0;
    uVar1 = *(undefined4 *)&elem_limits->is_shared;
    local_68.limits.is_shared = SUB41(uVar1,0);
    local_68.limits._18_2_ = SUB42((uint)uVar1 >> 8,0);
    local_68.limits._21_3_ = SUB43((uint)*(undefined4 *)&elem_limits->field_0x14 >> 8,0);
    local_68.limits._20_1_ = SUB41((uint)uVar1 >> 0x18,0);
    if ((local_68.limits.has_max & 1U) == 0) {
      local_68.limits.max._0_2_ = 0xffff;
      local_68.limits.max._2_2_ = 0xffff;
      local_68.limits.max._4_4_ = 0;
    }
    local_40.type.super_ExternType.kind = Table;
    local_40.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e48e0;
    local_40.type.limits.max._0_2_ = (undefined2)local_68.limits.max;
    local_40.type.limits.max._2_2_ = local_68.limits.max._2_2_;
    local_40.type.limits._12_6_ =
         SUB86(CONCAT17(local_68.limits.is_shared,
                        CONCAT16(local_68.limits.has_max,
                                 CONCAT42(local_68.limits.max._4_4_,local_68.limits.max._2_2_))) >>
               0x10,0);
    local_68.super_ExternType._12_4_ = elem_type.enum_;
    local_40.type.super_ExternType._12_4_ = elem_type.enum_;
    local_40.type.limits.initial = local_68.limits.initial;
    std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::
    emplace_back<wabt::interp::TableDesc>(&this->module_->tables,&local_40);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,&local_68);
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnTable(Index index,
                                   Type elem_type,
                                   const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(loc, elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.tables.push_back(TableDesc{table_type});
  table_types_.push_back(table_type);
  return Result::Ok;
}